

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTRuntimeInfoTracker.cpp
# Opt level: O0

void __thiscall
TTD::RuntimeContextInfo::EnqueueNewPathVarAsNeeded
          (RuntimeContextInfo *this,RecyclableObject *parent,Var val,char16 *propName,
          char16 *optacessortag)

{
  bool bVar1;
  HeapAllocator *alloc;
  TTAutoString *this_00;
  TrackAllocData local_70;
  TTAutoString *local_48;
  TTAutoString *tpath;
  TTAutoString *ppath;
  RecyclableObject *obj;
  char16 *optacessortag_local;
  char16 *propName_local;
  Var val_local;
  RecyclableObject *parent_local;
  RuntimeContextInfo *this_local;
  
  obj = (RecyclableObject *)optacessortag;
  optacessortag_local = propName;
  propName_local = (char16 *)val;
  val_local = parent;
  parent_local = (RecyclableObject *)this;
  bVar1 = JsSupport::IsVarTaggedInline(val);
  if ((!bVar1) &&
     ((bVar1 = JsSupport::IsVarPrimitiveKind(propName_local), !bVar1 ||
      (bVar1 = Js::VarIs<Js::GlobalObject,Js::RecyclableObject>((RecyclableObject *)val_local),
      bVar1)))) {
    ppath = (TTAutoString *)Js::VarTo<Js::RecyclableObject>(propName_local);
    bVar1 = JsUtil::
            BaseDictionary<Js::RecyclableObject_*,_TTD::UtilSupport::TTAutoString_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::ContainsKey(&this->m_coreObjToPathMap,(RecyclableObject **)&ppath);
    if (!bVar1) {
      tpath = JsUtil::
              BaseDictionary<Js::RecyclableObject_*,_TTD::UtilSupport::TTAutoString_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::Item(&this->m_coreObjToPathMap,(RecyclableObject **)&val_local);
      JsUtil::Queue<Js::RecyclableObject_*,_Memory::HeapAllocator>::Enqueue
                (&this->m_worklist,(RecyclableObject **)&ppath);
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_70,(type_info *)&UtilSupport::TTAutoString::typeinfo,0,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/TTRuntimeInfoTracker.cpp"
                 ,0x394);
      alloc = Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_70);
      this_00 = (TTAutoString *)new<Memory::HeapAllocator>(0x18,alloc,true,0x469be0);
      UtilSupport::TTAutoString::TTAutoString(this_00,tpath);
      local_48 = TTD_MEM_ALLOC_CHECK<TTD::UtilSupport::TTAutoString>(this_00);
      UtilSupport::TTAutoString::Append(local_48,L".",0,0xffffffffffffffff);
      UtilSupport::TTAutoString::Append(local_48,optacessortag_local,0,0xffffffffffffffff);
      if (obj != (RecyclableObject *)0x0) {
        UtilSupport::TTAutoString::Append(local_48,(char16 *)obj,0,0xffffffffffffffff);
      }
      bVar1 = JsUtil::
              BaseDictionary<Js::RecyclableObject_*,_TTD::UtilSupport::TTAutoString_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::ContainsKey(&this->m_coreObjToPathMap,(RecyclableObject **)&ppath);
      if (bVar1) {
        TTDAbort_unrecoverable_error("Already in map!!!");
      }
      JsUtil::
      BaseDictionary<Js::RecyclableObject_*,_TTD::UtilSupport::TTAutoString_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::AddNew(&this->m_coreObjToPathMap,(RecyclableObject **)&ppath,&local_48);
    }
  }
  return;
}

Assistant:

void RuntimeContextInfo::EnqueueNewPathVarAsNeeded(Js::RecyclableObject* parent, Js::Var val, const char16* propName, const char16* optacessortag)
    {
        if(JsSupport::IsVarTaggedInline(val))
        {
            return;
        }

        if(JsSupport::IsVarPrimitiveKind(val) && !Js::VarIs<Js::GlobalObject>(parent))
        {
            return; //we keep primitives from global object only -- may need others but this is a simple way to start to get undefined, null, infy, etc.
        }

        Js::RecyclableObject* obj = Js::VarTo<Js::RecyclableObject>(val);
        if(!this->m_coreObjToPathMap.ContainsKey(obj))
        {
            const UtilSupport::TTAutoString* ppath = this->m_coreObjToPathMap.Item(parent);

            this->m_worklist.Enqueue(obj);

            UtilSupport::TTAutoString* tpath = TT_HEAP_NEW(UtilSupport::TTAutoString, *ppath);
            tpath->Append(_u("."));
            tpath->Append(propName);

            if(optacessortag != nullptr)
            {
                tpath->Append(optacessortag);
            }

            TTDAssert(!this->m_coreObjToPathMap.ContainsKey(obj), "Already in map!!!");
            this->m_coreObjToPathMap.AddNew(obj, tpath);
        }
    }